

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
llb_buildsystem_command_interface_spawn::ForwardingProcessDelegate::processHadOutput(llbuild::basic
::ProcessContext*,llbuild::basic::ProcessHandle,llvm::StringRef_
          (void *this,ProcessContext *ctx,ProcessHandle handle,StringRef data)

{
  undefined8 *puVar1;
  llb_data_t message;
  
  puVar1 = *(undefined8 **)((long)this + 8);
  if (puVar1 != (undefined8 *)0x0) {
    (*(code *)puVar1[3])(*puVar1);
  }
  return;
}

Assistant:

virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      if (delegate != NULL) {
        llb_data_t message{ data.size(), (const uint8_t*) data.data() };
        delegate->process_had_output(delegate->context, &message);
      }
    }